

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signingprovider.cpp
# Opt level: O1

bool __thiscall
FillableSigningProvider::AddCScript(FillableSigningProvider *this,CScript *redeemScript)

{
  uint uVar1;
  string_view source_file;
  bool bVar2;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *this_00;
  Logger *pLVar3;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock4;
  string log_msg;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (redeemScript->super_CScriptBase)._size;
  if (uVar1 < 0x226) {
    local_70._M_dataplus._M_p = (pointer)&this->cs_KeyStore;
    local_70._M_string_length = local_70._M_string_length & 0xffffffffffffff00;
    std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_70);
    CScriptID::CScriptID((CScriptID *)&local_50,redeemScript);
    this_00 = &std::
               map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
               ::operator[](&this->mapScripts,(key_type *)&local_50)->super_CScriptBase;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
              (this_00,&redeemScript->super_CScriptBase);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&local_70);
  }
  else {
    pLVar3 = LogInstance();
    bVar2 = BCLog::Logger::Enabled(pLVar3);
    if (bVar2) {
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      tinyformat::format<unsigned_int>
                (&local_70,
                 "FillableSigningProvider::AddCScript(): redeemScripts > %i bytes are invalid\n",
                 &MAX_SCRIPT_ELEMENT_SIZE);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&local_50,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pLVar3 = LogInstance();
      local_70._M_dataplus._M_p = (pointer)0x63;
      local_70._M_string_length = 0x1169310;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/signingprovider.cpp"
      ;
      source_file._M_len = 99;
      str._M_str = local_50._M_dataplus._M_p;
      str._M_len = local_50._M_string_length;
      logging_function._M_str = "AddCScript";
      logging_function._M_len = 10;
      BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0xa1,ALL,Error);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar1 < 0x226;
  }
  __stack_chk_fail();
}

Assistant:

bool FillableSigningProvider::AddCScript(const CScript& redeemScript)
{
    if (redeemScript.size() > MAX_SCRIPT_ELEMENT_SIZE) {
        LogError("FillableSigningProvider::AddCScript(): redeemScripts > %i bytes are invalid\n", MAX_SCRIPT_ELEMENT_SIZE);
        return false;
    }

    LOCK(cs_KeyStore);
    mapScripts[CScriptID(redeemScript)] = redeemScript;
    return true;
}